

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# per_support.c
# Opt level: O0

ssize_t uper_get_nslength(asn_per_data_t *pd)

{
  int32_t iVar1;
  long lVar2;
  undefined8 in_RDI;
  int repeat;
  ssize_t length;
  int in_stack_0000007c;
  asn_per_data_t *in_stack_00000080;
  int local_1c;
  int *in_stack_ffffffffffffffe8;
  int ebits;
  asn_per_data_t *in_stack_fffffffffffffff8;
  
  ebits = (int)((ulong)in_RDI >> 0x20);
  ASN_DEBUG("Getting normally small length");
  iVar1 = per_get_few_bits(in_stack_00000080,in_stack_0000007c);
  if (iVar1 == 0) {
    iVar1 = per_get_few_bits(in_stack_00000080,in_stack_0000007c);
    lVar2 = (long)(int)(iVar1 + 1U);
    if (lVar2 < 1) {
      lVar2 = -1;
    }
    else {
      ASN_DEBUG("l=%d",(ulong)(iVar1 + 1U));
    }
  }
  else {
    lVar2 = uper_get_length(in_stack_fffffffffffffff8,ebits,in_stack_ffffffffffffffe8);
    if ((lVar2 < 0) || (local_1c != 0)) {
      lVar2 = -1;
    }
  }
  return lVar2;
}

Assistant:

ssize_t
uper_get_nslength(asn_per_data_t *pd) {
	ssize_t length;

	ASN_DEBUG("Getting normally small length");

	if(per_get_few_bits(pd, 1) == 0) {
		length = per_get_few_bits(pd, 6) + 1;
		if(length <= 0) return -1;
		ASN_DEBUG("l=%d", (int)length);
		return length;
	} else {
		int repeat;
		length = uper_get_length(pd, -1, &repeat);
		if(length >= 0 && !repeat) return length;
		return -1; /* Error, or do not support >16K extensions */
	}
}